

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_dict_putl(hd_context *ctx,pdf_obj *obj,pdf_obj *val,...)

{
  hd_error_stack_slot *phVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list keys;
  pdf_obj *val_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  keys[0].overflow_arg_area = local_e8;
  keys[0]._0_8_ = &stack0x00000008;
  local_38._4_4_ = 0x30;
  local_38._0_4_ = 0x18;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  keys[0].reg_save_area = val;
  iVar2 = hd_push_try(ctx);
  if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
    pdf_dict_vputl(ctx,obj,(pdf_obj *)keys[0].reg_save_area,(__va_list_tag *)local_38);
  }
  if (ctx->error->top->code < 3) {
    phVar1 = ctx->error->top;
    phVar1->code = phVar1->code + 1;
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    return;
  }
  hd_rethrow(ctx);
}

Assistant:

void
pdf_dict_putl(hd_context *ctx, pdf_obj *obj, pdf_obj *val, ...)
{
    va_list keys;
    va_start(keys, val);

    hd_try(ctx)
    pdf_dict_vputl(ctx, obj, val, keys);
    hd_always(ctx)
            va_end(keys);
    hd_catch(ctx)
    hd_rethrow(ctx);
}